

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::UninterpretedOption::InternalSerializeWithCachedSizesToArray
          (UninterpretedOption *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  UninterpretedOption_NamePart *this_00;
  uint64 uVar3;
  double dVar4;
  void *pvVar5;
  uint8 *target_00;
  int iVar6;
  uint8 *local_38;
  
  iVar1 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  local_38 = target;
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    this_00 = (UninterpretedOption_NamePart *)
              ((this->name_).super_RepeatedPtrFieldBase.rep_)->elements[iVar6];
    *local_38 = '\x12';
    target_00 = io::CodedOutputStream::WriteVarint32ToArray
                          ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_38 + 1
                          );
    local_38 = UninterpretedOption_NamePart::InternalSerializeWithCachedSizesToArray
                         (this_00,target_00,stream);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,3,(this->identifier_value_).ptr_,local_38);
  }
  if ((uVar2 & 8) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    uVar3 = this->positive_int_value_;
    *local_38 = ' ';
    local_38 = io::CodedOutputStream::WriteVarint64ToArray(uVar3,local_38 + 1);
  }
  if ((uVar2 & 0x10) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    uVar3 = this->negative_int_value_;
    *local_38 = '(';
    local_38 = io::CodedOutputStream::WriteVarint64ToArray(uVar3,local_38 + 1);
  }
  if ((uVar2 & 0x20) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    dVar4 = this->double_value_;
    *local_38 = '1';
    *(double *)(local_38 + 1) = dVar4;
    local_38 = local_38 + 9;
  }
  if ((uVar2 & 2) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,7,(this->string_value_).ptr_,local_38);
  }
  if ((uVar2 & 4) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,8,(this->aggregate_value_).ptr_,local_38);
  }
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    local_38 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe),local_38,stream);
  }
  return local_38;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* UninterpretedOption::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_name_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_name(i), target, stream);
  }

  cached_has_bits = _has_bits_[0];
  // optional string identifier_value = 3;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_identifier_value().data(), static_cast<int>(this->_internal_identifier_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.identifier_value");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_identifier_value(), target);
  }

  // optional uint64 positive_int_value = 4;
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(4, this->_internal_positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(5, this->_internal_negative_int_value(), target);
  }

  // optional double double_value = 6;
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(6, this->_internal_double_value(), target);
  }

  // optional bytes string_value = 7;
  if (cached_has_bits & 0x00000002u) {
    target = stream->WriteBytesMaybeAliased(
        7, this->_internal_string_value(), target);
  }

  // optional string aggregate_value = 8;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_aggregate_value().data(), static_cast<int>(this->_internal_aggregate_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.aggregate_value");
    target = stream->WriteStringMaybeAliased(
        8, this->_internal_aggregate_value(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption)
  return target;
}